

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void pnga_access_ghost_element(Integer g_a,AccessIndex *index,Integer *subscript,Integer *ld)

{
  long icode;
  ushort uVar1;
  int iVar2;
  C_Integer *pCVar3;
  global_array_t *pgVar4;
  Integer IVar5;
  ulong uVar6;
  Integer IVar7;
  SingleComplex **ppSVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  C_Integer CVar12;
  size_t __n;
  int _ndim;
  ulong uVar13;
  long lVar14;
  DoubleComplex *pDVar15;
  long lVar16;
  char *pcVar17;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer tmp_sub [7];
  int local_108 [8];
  long local_e8 [8];
  long local_a8 [7];
  long alStack_70 [8];
  
  icode = g_a + 1000;
  IVar5 = pnga_nodeid();
  pgVar4 = GA;
  uVar1 = GA[icode].ndim;
  uVar13 = (ulong)(short)uVar1;
  if (0 < (long)uVar13) {
    uVar6 = 0;
    do {
      alStack_70[uVar6 + 1] = subscript[uVar6] + -1;
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
  }
  iVar10 = GA[icode].distr_type;
  if (iVar10 - 1U < 3) {
    lVar9 = GA[icode].num_blocks[0];
    lVar11 = (long)(int)IVar5 % lVar9;
    local_108[0] = (int)lVar11;
    if (1 < (short)uVar1) {
      lVar16 = 0;
      IVar7 = IVar5;
      do {
        IVar7 = (long)((int)IVar7 - (int)lVar11) / lVar9;
        lVar9 = GA[g_a + 1000].num_blocks[lVar16 + 1];
        lVar11 = (long)(int)IVar7 % lVar9;
        local_108[lVar16 + 1] = (int)lVar11;
        lVar16 = lVar16 + 1;
      } while ((uVar13 & 0xffffffff) - 1 != lVar16);
    }
    if (0 < (short)uVar1) {
      lVar9 = 0;
      do {
        iVar10 = *(int *)((long)local_108 + lVar9);
        lVar11 = *(long *)((long)GA[g_a + 1000].block_dims + lVar9 * 2);
        *(long *)((long)local_a8 + lVar9 * 2) = lVar11 * iVar10 + 1;
        lVar11 = ((long)iVar10 + 1) * lVar11;
        lVar16 = *(long *)((long)GA[g_a + 1000].dims + lVar9 * 2);
        if (lVar16 <= lVar11) {
          lVar11 = lVar16;
        }
        *(long *)((long)local_e8 + lVar9 * 2) = lVar11;
        lVar9 = lVar9 + 4;
      } while ((uVar13 & 0xffffffff) << 2 != lVar9);
    }
  }
  else if (iVar10 == 4) {
    lVar9 = GA[icode].num_blocks[0];
    lVar11 = (long)(int)IVar5 % lVar9;
    local_108[0] = (int)lVar11;
    if (1 < (short)uVar1) {
      lVar16 = 0;
      IVar7 = IVar5;
      do {
        IVar7 = (long)((int)IVar7 - (int)lVar11) / lVar9;
        lVar9 = GA[g_a + 1000].num_blocks[lVar16 + 1];
        lVar11 = (long)(int)IVar7 % lVar9;
        local_108[lVar16 + 1] = (int)lVar11;
        lVar16 = lVar16 + 1;
      } while ((uVar13 & 0xffffffff) - 1 != lVar16);
    }
    if (0 < (short)uVar1) {
      pCVar3 = GA[icode].mapc;
      lVar9 = 0;
      iVar10 = 0;
      do {
        iVar2 = *(int *)((long)local_108 + lVar9);
        lVar16 = (long)iVar10 + (long)iVar2;
        *(C_Integer *)((long)local_a8 + lVar9 * 2) = pCVar3[lVar16];
        lVar11 = *(long *)((long)GA[icode].num_blocks + lVar9 * 2);
        if ((long)iVar2 < lVar11 + -1) {
          lVar16 = pCVar3[lVar16 + 1] + -1;
        }
        else {
          lVar16 = *(long *)((long)GA[icode].dims + lVar9 * 2);
        }
        *(long *)((long)local_e8 + lVar9 * 2) = lVar16;
        iVar10 = iVar10 + (int)lVar11;
        lVar9 = lVar9 + 4;
      } while ((uVar13 & 0xffffffff) << 2 != lVar9);
    }
  }
  else if (iVar10 == 0) {
    if (GA[icode].num_rstrctd == 0) {
      if (0 < (short)uVar1) {
        lVar9 = 1;
        uVar6 = 0;
        do {
          lVar9 = lVar9 * GA[g_a + 1000].nblock[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
        if ((IVar5 < 0) || (lVar9 <= IVar5)) {
LAB_00183a2b:
          if (0 < (short)uVar1) {
            __n = uVar13 * 8;
            goto LAB_00183a38;
          }
        }
        else if (0 < (short)uVar1) {
          pCVar3 = GA[icode].mapc;
          lVar9 = 0;
          uVar6 = 0;
          IVar7 = IVar5;
          do {
            lVar16 = (long)GA[g_a + 1000].nblock[uVar6];
            lVar11 = IVar7 % lVar16;
            local_a8[uVar6] = pCVar3[lVar11 + lVar9];
            if (lVar11 == lVar16 + -1) {
              CVar12 = GA[g_a + 1000].dims[uVar6];
            }
            else {
              CVar12 = pCVar3[lVar11 + lVar9 + 1] + -1;
            }
            lVar9 = lVar9 + lVar16;
            local_e8[uVar6] = CVar12;
            uVar6 = uVar6 + 1;
            IVar7 = IVar7 / lVar16;
          } while (uVar13 != uVar6);
        }
      }
    }
    else if (IVar5 < GA[icode].num_rstrctd) {
      if (0 < (short)uVar1) {
        lVar9 = 1;
        uVar6 = 0;
        do {
          lVar9 = lVar9 * GA[g_a + 1000].nblock[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
        if ((IVar5 < 0) || (lVar9 <= IVar5)) goto LAB_00183a2b;
        if (0 < (short)uVar1) {
          pCVar3 = GA[icode].mapc;
          lVar9 = 0;
          uVar6 = 0;
          IVar7 = IVar5;
          do {
            lVar16 = (long)GA[g_a + 1000].nblock[uVar6];
            lVar11 = IVar7 % lVar16;
            local_a8[uVar6] = pCVar3[lVar11 + lVar9];
            if (lVar11 == lVar16 + -1) {
              CVar12 = GA[g_a + 1000].dims[uVar6];
            }
            else {
              CVar12 = pCVar3[lVar11 + lVar9 + 1] + -1;
            }
            lVar9 = lVar9 + lVar16;
            local_e8[uVar6] = CVar12;
            uVar6 = uVar6 + 1;
            IVar7 = IVar7 / lVar16;
          } while (uVar13 != uVar6);
        }
      }
    }
    else if (0 < (short)uVar1) {
      __n = (ulong)uVar1 << 3;
LAB_00183a38:
      memset(local_a8,0,__n);
      memset(local_e8,0xff,__n);
    }
  }
  if (uVar13 == 1) {
    *ld = (local_e8[0] - local_a8[0]) + pgVar4[icode].width[0] * 2 + 1;
  }
  if ((short)uVar1 < 2) {
    lVar11 = 1;
    lVar9 = 0;
  }
  else {
    lVar11 = 1;
    lVar16 = 0;
    lVar9 = 0;
    do {
      lVar9 = lVar9 + alStack_70[lVar16 + 1] * lVar11;
      lVar14 = (local_e8[lVar16] - local_a8[lVar16]) + pgVar4[g_a + 1000].width[lVar16] * 2 + 1;
      ld[lVar16] = lVar14;
      lVar11 = lVar11 * lVar14;
      lVar16 = lVar16 + 1;
    } while (uVar13 - 1 != lVar16);
  }
  uVar6 = (ulong)pgVar4[icode].elemsize;
  pcVar17 = pgVar4[icode].ptr[IVar5] + (lVar11 * alStack_70[uVar13] + lVar9) * uVar6;
  IVar5 = pnga_type_c2f((long)pgVar4[icode].type);
  switch(IVar5) {
  case 0x3f2:
    ppSVar8 = (SingleComplex **)&INT_MB;
    break;
  default:
    pDVar15 = (DoubleComplex *)0x0;
    goto LAB_00183b97;
  case 0x3f4:
    lVar9 = (long)pcVar17 - (long)FLT_MB >> 2;
    pDVar15 = (DoubleComplex *)FLT_MB;
    goto LAB_00183b8f;
  case 0x3f5:
    ppSVar8 = (SingleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppSVar8 = &SCPL_MB;
    break;
  case 0x3f7:
    lVar9 = (long)pcVar17 - (long)DCPL_MB >> 4;
    pDVar15 = DCPL_MB;
    goto LAB_00183b8f;
  }
  pDVar15 = (DoubleComplex *)*ppSVar8;
  lVar9 = (long)pcVar17 - (long)pDVar15 >> 3;
LAB_00183b8f:
  *index = lVar9;
LAB_00183b97:
  if ((ulong)pcVar17 % uVar6 != (ulong)pDVar15 % uVar6) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,pcVar17,(ulong)pcVar17 % uVar6,
           pDVar15,(ulong)pDVar15 % uVar6);
    pnga_error("nga_access: MA addressing problem: base address misallignment",icode);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_ghost_element(Integer g_a, AccessIndex* index,
                        Integer subscript[], Integer ld[])
{
char *ptr=NULL;
Integer  handle = GA_OFFSET + g_a;
Integer i=0;
Integer tmp_sub[MAXDIM];
unsigned long    elemsize=0;
unsigned long    lref=0, lptr=0;
Integer me = pnga_nodeid();
   /* Indices conform to Fortran convention. Shift them down 1 so that
      gam_LocationWithGhosts works. */
   for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1;
   gam_LocationWithGhosts(me, handle, tmp_sub, &ptr, ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;

   FLUSH_CACHE;
}